

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.h
# Opt level: O0

void __thiscall Rml::Property::Property<float>(Property *this,float value,Unit unit,int specificity)

{
  int specificity_local;
  Unit unit_local;
  float value_local;
  Property *this_local;
  
  specificity_local = (int)value;
  _unit_local = this;
  Variant::Variant<float&,void>(&this->value,(float *)&specificity_local);
  this->unit = unit;
  this->specificity = specificity;
  this->definition = (PropertyDefinition *)0x0;
  this->parser_index = -1;
  ::std::shared_ptr<const_Rml::PropertySource>::shared_ptr(&this->source);
  this->definition = (PropertyDefinition *)0x0;
  this->parser_index = -1;
  return;
}

Assistant:

Property(PropertyType value, Unit unit, int specificity = -1) : value(value), unit(unit), specificity(specificity)
	{
		definition = nullptr;
		parser_index = -1;
	}